

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

int ffgmrm(fitsfile *gfptr,long member,int rmopt,int *status)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  int *in_RCX;
  int in_EDX;
  fitsfile *in_RSI;
  fitsfile *in_RDI;
  bool bVar4;
  fitsfile *mfptr;
  char grootname [1025];
  char mrootname [1025];
  char *editLocation;
  char card [81];
  char keyvalue [71];
  char *tgrplc;
  char grplc [1025];
  char keyword [75];
  char cwd [1025];
  char grpLocation3 [1025];
  char grpLocation2 [1025];
  char grpLocation1 [1025];
  long grpid;
  long groupExtver;
  long nmembers;
  long ngroups;
  long i;
  int iomode;
  int index;
  int hdutype;
  int found;
  int *card_00;
  undefined4 in_stack_ffffffffffffe200;
  int in_stack_ffffffffffffe204;
  fitsfile *in_stack_ffffffffffffe208;
  char *in_stack_ffffffffffffe218;
  undefined7 in_stack_ffffffffffffe228;
  undefined1 in_stack_ffffffffffffe22f;
  fitsfile *fptr;
  fitsfile *in_stack_ffffffffffffe238;
  char *in_stack_ffffffffffffe240;
  long *in_stack_ffffffffffffe248;
  char *in_stack_ffffffffffffe250;
  fitsfile *in_stack_ffffffffffffe258;
  int *in_stack_ffffffffffffe288;
  long *in_stack_ffffffffffffe290;
  fitsfile *in_stack_ffffffffffffe298;
  LONGLONG in_stack_ffffffffffffe2a0;
  fitsfile *in_stack_ffffffffffffe2a8;
  int *in_stack_ffffffffffffe300;
  fitsfile *in_stack_ffffffffffffe308;
  int *in_stack_ffffffffffffe388;
  long *in_stack_ffffffffffffe390;
  fitsfile *in_stack_ffffffffffffe398;
  int *in_stack_ffffffffffffe3a8;
  char *in_stack_ffffffffffffe3b0;
  fitsfile *in_stack_ffffffffffffe3b8;
  int *in_stack_ffffffffffffe600;
  char *in_stack_ffffffffffffe608;
  char local_19b8 [16];
  int *in_stack_ffffffffffffe658;
  char *in_stack_ffffffffffffe660;
  char *in_stack_ffffffffffffe668;
  int *in_stack_ffffffffffffeba8;
  int in_stack_ffffffffffffebb4;
  fitsfile *in_stack_ffffffffffffebb8;
  char local_10e8 [80];
  char local_1098 [1040];
  char local_c88 [1040];
  char local_878 [744];
  int *in_stack_fffffffffffffa70;
  char *in_stack_fffffffffffffa78;
  char *in_stack_fffffffffffffa80;
  char *in_stack_fffffffffffffa88;
  char *in_stack_fffffffffffffa90;
  fitsfile *in_stack_fffffffffffffa98;
  int *in_stack_fffffffffffffab0;
  char local_468 [136];
  int *in_stack_fffffffffffffc20;
  fitsfile **in_stack_fffffffffffffc28;
  long in_stack_fffffffffffffc30;
  fitsfile *in_stack_fffffffffffffc38;
  long local_40;
  int local_38;
  uint local_34;
  int iVar5;
  undefined4 in_stack_ffffffffffffffd4;
  uint uVar6;
  undefined4 in_stack_ffffffffffffffe0;
  
  iVar5 = 0;
  local_38 = 0;
  fptr = (fitsfile *)0x0;
  if (*in_RCX != 0) {
    return *in_RCX;
  }
  ffflmd(in_RDI,&local_38,in_RCX);
  if (local_38 == 1) {
    iVar1 = ffgmop(in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
                   in_stack_fffffffffffffc20);
    *in_RCX = iVar1;
    iVar1 = ffflmd(fptr,&local_38,in_RCX);
    *in_RCX = iVar1;
    if (in_EDX == 2) {
      iVar1 = ffghdn(fptr,(int *)&stack0xffffffffffffffd0);
      if (iVar1 == 1) {
        *in_RCX = 0x12d;
      }
      else {
        iVar1 = ffgkys(in_stack_ffffffffffffe258,in_stack_ffffffffffffe250,
                       (char *)in_stack_ffffffffffffe248,in_stack_ffffffffffffe240,
                       &in_stack_ffffffffffffe238->HDUposition);
        *in_RCX = iVar1;
        if (*in_RCX == 0xca) {
          *in_RCX = 0;
        }
        prepare_keyvalue((char *)CONCAT44(in_stack_ffffffffffffe204,in_stack_ffffffffffffe200));
        if (*in_RCX == 0) {
          iVar1 = fits_strcasecmp((char *)in_stack_ffffffffffffe208,
                                  (char *)CONCAT44(in_stack_ffffffffffffe204,
                                                   in_stack_ffffffffffffe200));
          if (iVar1 == 0) {
            iVar1 = ffgtnm(in_stack_ffffffffffffe298,in_stack_ffffffffffffe290,
                           in_stack_ffffffffffffe288);
            *in_RCX = iVar1;
            local_40 = 0;
            while( true ) {
              bVar4 = false;
              if (0 < local_40) {
                bVar4 = *in_RCX == 0;
              }
              if (!bVar4) break;
              iVar1 = ffgmrm(in_RSI,CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                             (int)((ulong)in_RCX >> 0x20),
                             (int *)CONCAT44(in_stack_ffffffffffffffd4,iVar5));
              *in_RCX = iVar1;
              local_40 = local_40 + -1;
            }
            if (*in_RCX != 0) goto LAB_001c7eb9;
            in_stack_ffffffffffffe22f = 0;
          }
          iVar5 = ffgmul(in_stack_ffffffffffffebb8,in_stack_ffffffffffffebb4,
                         in_stack_ffffffffffffeba8);
          *in_RCX = iVar5;
          if ((*in_RCX == 0) &&
             (ffrdef(in_stack_ffffffffffffe308,in_stack_ffffffffffffe300), local_38 != 0)) {
            iVar5 = ffdhdu(in_stack_ffffffffffffe238,&fptr->HDUposition,
                           (int *)CONCAT17(in_stack_ffffffffffffe22f,in_stack_ffffffffffffe228));
            *in_RCX = iVar5;
          }
        }
      }
    }
    else if (in_EDX == 1) {
      if (local_38 == 1) {
        iVar5 = ffgkyj(in_stack_ffffffffffffe258,in_stack_ffffffffffffe250,in_stack_ffffffffffffe248
                       ,in_stack_ffffffffffffe240,&in_stack_ffffffffffffe238->HDUposition);
        *in_RCX = iVar5;
        ffrtnm(in_stack_ffffffffffffe668,in_stack_ffffffffffffe660,in_stack_ffffffffffffe658);
        ffrtnm(in_stack_ffffffffffffe668,in_stack_ffffffffffffe660,in_stack_ffffffffffffe658);
        card_00 = in_RCX;
        if (fptr->Fptr != in_RDI->Fptr) {
          strncmp(local_19b8,&stack0xffffffffffffe238,0x401);
          card_00 = in_RCX;
        }
        in_RCX = card_00;
        iVar5 = fits_get_url(in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
                             in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,
                             in_stack_fffffffffffffa78,in_stack_fffffffffffffa70,
                             in_stack_fffffffffffffab0);
        *in_RCX = iVar5;
        if (*in_RCX != 0) goto LAB_001c7eb9;
        iVar5 = fits_get_cwd(in_stack_ffffffffffffe608,in_stack_ffffffffffffe600);
        *in_RCX = iVar5;
        if (((local_468[0] != '\0') && (local_468[0] != '/')) &&
           (iVar5 = fits_is_url_absolute(in_stack_ffffffffffffe218), iVar5 == 0)) {
          strcpy(local_c88,local_1098);
          sVar2 = strlen(local_c88);
          sVar3 = strlen(local_468);
          if (0x400 < sVar2 + sVar3 + 1) {
            ffpmsg((char *)0x1c7855);
            *in_RCX = 0x7d;
            goto LAB_001c7eb9;
          }
          strcat(local_c88,"/");
          strcat(local_c88,local_468);
          fits_clean_url((char *)in_stack_ffffffffffffe238,(char *)fptr,
                         (int *)CONCAT17(in_stack_ffffffffffffe22f,in_stack_ffffffffffffe228));
        }
        if (((local_878[0] != '\0') && (local_878[0] != '/')) &&
           (iVar5 = fits_is_url_absolute(in_stack_ffffffffffffe218), iVar5 == 0)) {
          strcpy(local_c88,local_1098);
          sVar2 = strlen(local_c88);
          sVar3 = strlen(local_878);
          if (0x400 < sVar2 + sVar3 + 1) {
            ffpmsg((char *)0x1c793d);
            *in_RCX = 0x7d;
            goto LAB_001c7eb9;
          }
          strcat(local_c88,"/");
          strcat(local_c88,local_878);
          fits_clean_url((char *)in_stack_ffffffffffffe238,(char *)fptr,
                         (int *)CONCAT17(in_stack_ffffffffffffe22f,in_stack_ffffffffffffe228));
        }
        iVar5 = ffgmng(in_stack_ffffffffffffe398,in_stack_ffffffffffffe390,in_stack_ffffffffffffe388
                      );
        *in_RCX = iVar5;
        iVar5 = ffgrec(in_stack_ffffffffffffe208,in_stack_ffffffffffffe204,(char *)card_00,
                       (int *)0x1c79d8);
        *in_RCX = iVar5;
        local_34 = 1;
        uVar6 = 0;
        while( true ) {
          bVar4 = false;
          if (((int)local_34 < 1) && (bVar4 = false, *in_RCX == 0)) {
            bVar4 = uVar6 == 0;
          }
          if (!bVar4) break;
          snprintf(local_10e8,0x4b,"GRPID%d",(ulong)local_34);
          iVar5 = ffgkyj(in_stack_ffffffffffffe258,in_stack_ffffffffffffe250,
                         in_stack_ffffffffffffe248,in_stack_ffffffffffffe240,
                         &in_stack_ffffffffffffe238->HDUposition);
          *in_RCX = iVar5;
          local_34 = local_34 + 1;
        }
        if (uVar6 != 0) {
          snprintf(local_10e8,0x4b,"GRPID%d",(ulong)uVar6);
          iVar5 = ffdkey(in_stack_ffffffffffffe3b8,in_stack_ffffffffffffe3b0,
                         in_stack_ffffffffffffe3a8);
          *in_RCX = iVar5;
          snprintf(local_10e8,0x4b,"GRPLC%d",(ulong)uVar6);
          iVar5 = ffdkey(in_stack_ffffffffffffe3b8,in_stack_ffffffffffffe3b0,
                         in_stack_ffffffffffffe3a8);
          *in_RCX = iVar5;
          *in_RCX = 0;
          iVar5 = ffgmng(in_stack_ffffffffffffe398,in_stack_ffffffffffffe390,
                         in_stack_ffffffffffffe388);
          *in_RCX = iVar5;
        }
      }
      iVar5 = ffdrow(in_stack_ffffffffffffe2a8,in_stack_ffffffffffffe2a0,
                     (LONGLONG)in_stack_ffffffffffffe298,(int *)in_stack_ffffffffffffe290);
      *in_RCX = iVar5;
    }
    else {
      *in_RCX = 0x15b;
      ffpmsg((char *)0x1c7eb5);
    }
  }
  else {
    ffpmsg((char *)0x1c740d);
    *in_RCX = 0x15e;
  }
LAB_001c7eb9:
  if (fptr != (fitsfile *)0x0) {
    ffclos(in_stack_ffffffffffffe208,
           (int *)CONCAT44(in_stack_ffffffffffffe204,in_stack_ffffffffffffe200));
  }
  return *in_RCX;
}

Assistant:

int ffgmrm(fitsfile *gfptr,  /* FITS file pointer to group table             */
	   long      member, /* member ID (row num) in the group             */
	   int       rmopt,  /* code specifying the delete option:
				OPT_RM_ENTRY ==> delete the member entry
				OPT_RM_MBR   ==> delete entry and member HDU */
	   int      *status)  /* return status code                          */

/*
  remove a member HDU from a grouping table. The fitsfile pointer gfptr must
  be positioned with the grouping table as the CHDU, and the member to 
  delete is identified by its row number in the table (first member == 1).
  The rmopt parameter determines if the member entry is deleted from the
  grouping table (in which case GRPIDn and GRPLCn keywords in the member 
  HDU's header shall be updated accordingly) or if the member HDU shall 
  itself be removed from its FITS file.
*/

{
  int found;
  int hdutype   = 0;
  int index;
  int iomode    = 0;

  long i;
  long ngroups      = 0;
  long nmembers     = 0;
  long groupExtver  = 0;
  long grpid        = 0;

  char grpLocation1[FLEN_FILENAME];
  char grpLocation2[FLEN_FILENAME];
  char grpLocation3[FLEN_FILENAME];
  char cwd[FLEN_FILENAME];
  char keyword[FLEN_KEYWORD];
  /* SPR 1738 This can now be longer */
  char grplc[FLEN_FILENAME];
  char *tgrplc;
  char keyvalue[FLEN_VALUE];
  char card[FLEN_CARD];
  char *editLocation;
  char mrootname[FLEN_FILENAME], grootname[FLEN_FILENAME];

  fitsfile *mfptr  = NULL;


  if(*status != 0) return(*status);

  do
    {
      /*
	make sure the grouping table can be modified before proceeding
      */

      fits_file_mode(gfptr,&iomode,status);

      if(iomode != READWRITE)
	{
	  ffpmsg("cannot modify grouping table (ffgtam)");
	  *status = BAD_GROUP_DETACH;
	  continue;
	}

      /* open the group member to be deleted and get its IOstatus*/

      *status = fits_open_member(gfptr,member,&mfptr,status);
      *status = fits_file_mode(mfptr,&iomode,status);

      /*
	 if the member HDU is to be deleted then call fits_unlink_member()
	 to remove it from all groups to which it belongs (including
	 this one) and then delete it. Note that if the member is a
	 grouping table then we have to recursively call fits_remove_member()
	 for each member of the member before we delete the member itself.
      */

      if(rmopt == OPT_RM_MBR)
	{
	    /* cannot delete a PHDU */
	    if(fits_get_hdu_num(mfptr,&hdutype) == 1)
		{
		    *status = BAD_HDU_NUM;
		    continue;
		}

	  /* determine if the member HDU is itself a grouping table */

	  *status = fits_read_key_str(mfptr,"EXTNAME",keyvalue,card,status);

	  /* if no EXTNAME is found then the HDU cannot be a grouping table */ 

	  if(*status == KEY_NO_EXIST) 
	    {
	      keyvalue[0] = 0;
	      *status = 0;
	    }
	  prepare_keyvalue(keyvalue);

	  /* Any other error is a reason to abort */

	  if(*status != 0) continue;

	  /* if the EXTNAME == GROUPING then the member is a grouping table */
	  
	  if(fits_strcasecmp(keyvalue,"GROUPING") == 0)
	    {
	      /* remove each of the grouping table members */
	      
	      *status = fits_get_num_members(mfptr,&nmembers,status);
	      
	      for(i = nmembers; i > 0 && *status == 0; --i)
		*status = fits_remove_member(mfptr,i,OPT_RM_ENTRY,status);
	      
	      if(*status != 0) continue;
	    }

	  /* unlink the member HDU from all groups that contain it */

	  *status = ffgmul(mfptr,0,status);

	  if(*status != 0) continue;
 
	  /* reset the grouping table HDU struct */

	  fits_set_hdustruc(gfptr,status);

	  /* delete the member HDU */

	  if(iomode != READONLY)
	    *status = fits_delete_hdu(mfptr,&hdutype,status);
	}
      else if(rmopt == OPT_RM_ENTRY)
	{
	  /* 
	     The member HDU is only to be removed as an entry from this
	     grouping table. Actions are (1) find the GRPIDn/GRPLCn 
	     keywords that link the member to the grouping table, (2)
	     remove the GRPIDn/GRPLCn keyword from the member HDU header
	     and (3) remove the member entry from the grouping table
	  */

	  /*
	    there is no need to seach for and remove the GRPIDn/GRPLCn
	    keywords from the member HDU if it has not been opened
	    in READWRITE mode
	  */

	  if(iomode == READWRITE)
	    {	  	      
	      /* 
		 determine the group EXTVER value of the grouping table; if
		 the member HDU and grouping table HDU do not reside in the 
		 same file then set the groupExtver value to its negative 
	      */
	      
	      *status = fits_read_key_lng(gfptr,"EXTVER",&groupExtver,card,
					  status);
	      /* Now, if either the Fptr values are the same, or the root filenames
	         are the same, then assume these refer to the same file.
	      */
	      fits_parse_rootname(mfptr->Fptr->filename, mrootname, status);
	      fits_parse_rootname(gfptr->Fptr->filename, grootname, status);

	      if((mfptr->Fptr != gfptr->Fptr) && 
	          strncmp(mrootname, grootname, FLEN_FILENAME))
                       groupExtver = -1*groupExtver;
	      
	      /*
		retrieve the URLs for the grouping table; note that it is 
		possible that the grouping table file has two URLs, the 
		one used to open it and the "real" one pointing to the 
		actual file being accessed
	      */
	      
	      *status = fits_get_url(gfptr,grpLocation1,grpLocation2,NULL,
				     NULL,NULL,status);
	      
	      if(*status != 0) continue;
	      
	      /*
		if either of the group location strings specify a relative
		file path then convert them into absolute file paths
	      */

	      *status = fits_get_cwd(cwd,status);
	      
	      if(*grpLocation1 != 0 && *grpLocation1 != '/' &&
		 !fits_is_url_absolute(grpLocation1))
		{
		  strcpy(grpLocation3,cwd);
                  if (strlen(grpLocation3)+strlen(grpLocation1)+1 > 
                            FLEN_FILENAME-1)
                  {
                     ffpmsg("group locations are too long (ffgmrm)");
                     *status = URL_PARSE_ERROR;
                     continue;
                  }
		  strcat(grpLocation3,"/");
		  strcat(grpLocation3,grpLocation1);
		  fits_clean_url(grpLocation3,grpLocation1,status);
		}
	      
	      if(*grpLocation2 != 0 && *grpLocation2 != '/' &&
		 !fits_is_url_absolute(grpLocation2))
		{
		  strcpy(grpLocation3,cwd);
                  if (strlen(grpLocation3)+strlen(grpLocation2)+1 > 
                            FLEN_FILENAME-1)
                  {
                     ffpmsg("group locations are too long (ffgmrm)");
                     *status = URL_PARSE_ERROR;
                     continue;
                  }
		  strcat(grpLocation3,"/");
		  strcat(grpLocation3,grpLocation2);
		  fits_clean_url(grpLocation3,grpLocation2,status);
		}
	      
	      /*
		determine the number of groups to which the member HDU 
		belongs
	      */
	      
	      *status = fits_get_num_groups(mfptr,&ngroups,status);
	      
	      /* reset the HDU keyword position counter to the beginning */
	      
	      *status = ffgrec(mfptr,0,card,status);
	      
	      /*
		loop over all the GRPIDn keywords in the member HDU header 
		and find the appropriate GRPIDn and GRPLCn keywords that 
		identify it as belonging to the group
	      */
	      
	      for(index = 1, found = 0; index <= ngroups && *status == 0 && 
		    !found; ++index)
		{	  
		  /* read the next GRPIDn keyword in the series */
		  
		  snprintf(keyword,FLEN_KEYWORD,"GRPID%d",index);
		  
		  *status = fits_read_key_lng(mfptr,keyword,&grpid,card,
					      status);
		  if(*status != 0) continue;
		  
		  /* 
		     grpid value == group EXTVER value then we could have a 
		     match
		  */
		  
		  if(grpid == groupExtver && grpid > 0)
		    {
		      /*
			if GRPID is positive then its a match because 
			both the member HDU and grouping table HDU reside
			in the same FITS file
		      */
		      
		      found = index;
		    }
		  else if(grpid == groupExtver && grpid < 0)
		    {
		      /* 
			 have to look at the GRPLCn value to determine a 
			 match because the member HDU and grouping table 
			 HDU reside in different FITS files
		      */
		      
		      snprintf(keyword,FLEN_KEYWORD,"GRPLC%d",index);
		      
		      /* SPR 1738 */
		      *status = fits_read_key_longstr(mfptr,keyword,&tgrplc,
						      card, status);
		      if (0 == *status) {
			strcpy(grplc,tgrplc);
			free(tgrplc);
		      }
		      		      
		      if(*status == KEY_NO_EXIST)
			{
			  /* 
			     no GRPLCn keyword value found ==> grouping
			     convention not followed; nothing we can do 
			     about it, so just continue
			  */
			  
			  snprintf(card,FLEN_CARD,"No GRPLC%d found for GRPID%d",
				  index,index);
			  ffpmsg(card);
			  *status = 0;
			  continue;
			}
		      else if (*status != 0) continue;
		      
		      /* construct the URL for the GRPLCn value */
		      
		      prepare_keyvalue(grplc);
		      
		      /*
			if the grplc value specifies a relative path then
			turn it into a absolute file path for comparison
			purposes
		      */
		      
		      if(*grplc != 0 && !fits_is_url_absolute(grplc) &&
			 *grplc != '/')
			{
			    /* No, wrong, 
			       strcpy(grpLocation3,cwd);
			       should be */
			    *status = fits_file_name(mfptr,grpLocation3,status);
			    /* Remove everything after the last / */
			    if (NULL != (editLocation = strrchr(grpLocation3,'/'))) {
				*editLocation = '\0';
			    }
				
                          if (strlen(grpLocation3)+strlen(grplc)+1 > 
                                    FLEN_FILENAME-1)
                          {
                             ffpmsg("group locations are too long (ffgmrm)");
                             *status = URL_PARSE_ERROR;
                             continue;
                          }
			  strcat(grpLocation3,"/");
			  strcat(grpLocation3,grplc);
			  *status = fits_clean_url(grpLocation3,grplc,
						   status);
			}
		      
		      /*
			if the absolute value of GRPIDn is equal to the
			EXTVER value of the grouping table and (one of the 
			possible two) grouping table file URL matches the
			GRPLCn keyword value then we hava a match
		      */
		      
		      if(strcmp(grplc,grpLocation1) == 0  || 
			 strcmp(grplc,grpLocation2) == 0) 
			found = index; 
		    }
		}

	      /*
		if found == 0 (false) after the above search then we assume 
		that it is due to an inpromper updating of the GRPIDn and 
		GRPLCn keywords in the member header ==> nothing to delete 
		in the header. Else delete the GRPLCn and GRPIDn keywords 
		that identify the member HDU with the group HDU and 
		re-enumerate the remaining GRPIDn and GRPLCn keywords
	      */

	      if(found != 0)
		{
		  snprintf(keyword,FLEN_KEYWORD,"GRPID%d",found);
		  *status = fits_delete_key(mfptr,keyword,status);
		  
		  snprintf(keyword,FLEN_KEYWORD,"GRPLC%d",found);
		  *status = fits_delete_key(mfptr,keyword,status);
		  
		  *status = 0;
		  
		  /* call fits_get_num_groups() to re-enumerate the GRPIDn */
		  
		  *status = fits_get_num_groups(mfptr,&ngroups,status);
		} 
	    }

	  /*
	     finally, remove the member entry from the current grouping table
	     pointed to by gfptr
	  */

	  *status = fits_delete_rows(gfptr,member,1,status);
	}
      else
	{
	  *status = BAD_OPTION;
	  ffpmsg("Invalid value specified for the rmopt parameter (ffgmrm)");
	}

    }while(0);

  if(mfptr != NULL) 
    {
      fits_close_file(mfptr,status);
    }

  return(*status);
}